

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O0

int ctemplate_htmlparser::htmlparser_is_url_start(htmlparser_ctx *ctx)

{
  int iVar1;
  meta_redirect_type_enum mVar2;
  char *pcVar3;
  char *tag;
  htmlparser_ctx *ctx_local;
  
  iVar1 = htmlparser_attr_type(ctx);
  if (iVar1 == 2) {
    pcVar3 = htmlparser_tag(ctx);
    htmlparser_attr(ctx);
    if ((pcVar3 == (char *)0x0) || (iVar1 = strcmp(pcVar3,"meta"), iVar1 != 0)) {
LAB_001845c2:
      iVar1 = htmlparser_value_index(ctx);
      if (iVar1 != 0) goto LAB_001845db;
    }
    else {
      pcVar3 = htmlparser_value(ctx);
      mVar2 = meta_redirect_type(pcVar3);
      if (mVar2 != META_REDIRECT_TYPE_URL_START) goto LAB_001845c2;
    }
    ctx_local._4_4_ = 1;
  }
  else {
LAB_001845db:
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int htmlparser_is_url_start(htmlparser_ctx *ctx)
{
  if (htmlparser_attr_type(ctx) == HTMLPARSER_ATTR_URI) {
    const char* tag = htmlparser_tag(ctx);
    /*const char* attr =*/ htmlparser_attr(ctx);

    if ((tag && strcmp(tag, "meta") == 0 &&
         meta_redirect_type(htmlparser_value(ctx)) ==
         META_REDIRECT_TYPE_URL_START) ||
        htmlparser_value_index(ctx) == 0)
      return 1;

  }
  return 0;
}